

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O3

QPointF __thiscall QVariant::toPointF(QVariant *this)

{
  PrivateShared *pPVar1;
  ulong uVar2;
  QPointF QVar3;
  bool bVar4;
  long in_FS_OFFSET;
  QMetaType local_30;
  QMetaType local_28;
  qreal qStack_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_30.d_ptr = &QtPrivate::QMetaTypeInterfaceWrapper<QPointF>::metaType;
  local_28.d_ptr = (QMetaTypeInterface *)(*(ulong *)&(this->d).field_0x18 & 0xfffffffffffffffc);
  bVar4 = ::comparesEqual(&local_28,&local_30);
  if (bVar4) {
    if (((this->d).field_0x18 & 1) != 0) {
      pPVar1 = (this->d).data.shared;
      this = (QVariant *)
             ((long)&(pPVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
                     .super___atomic_base<int> + (long)pPVar1->offset);
    }
    local_28.d_ptr = (QMetaTypeInterface *)(this->d).data.shared;
    qStack_20 = *(qreal *)((long)&(this->d).data + 8);
  }
  else {
    local_28.d_ptr = (QMetaTypeInterface *)0x0;
    qStack_20 = 0.0;
    uVar2 = *(ulong *)&(this->d).field_0x18;
    if ((uVar2 & 1) != 0) {
      pPVar1 = (this->d).data.shared;
      this = (QVariant *)
             ((long)&(pPVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
                     .super___atomic_base<int> + (long)pPVar1->offset);
    }
    QMetaType::convert((QMetaTypeInterface *)(uVar2 & 0xfffffffffffffffc),this,local_30,&local_28);
  }
  QVar3.yp = qStack_20;
  QVar3.xp = (qreal)local_28.d_ptr;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return QVar3;
  }
  __stack_chk_fail();
}

Assistant:

QPointF QVariant::toPointF() const
{
    return qvariant_cast<QPointF>(*this);
}